

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_connections_limit(session_impl *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar5;
  int *piVar6;
  error_code local_98;
  int local_88;
  int local_84;
  int local_80;
  int disconnect;
  int my_average;
  int num_1;
  shared_ptr<libtorrent::aux::torrent> *t_1;
  iterator __end3;
  iterator __begin3;
  torrent_list<libtorrent::aux::torrent> *__range3;
  int num;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end4;
  iterator __begin4;
  torrent_list<libtorrent::aux::torrent> *__range4;
  int local_28;
  int num_above;
  int iter;
  int extra;
  int average;
  int last_average;
  int to_disconnect;
  int limit;
  session_impl *this_local;
  
  _to_disconnect = this;
  last_average = session_settings::get_int(&this->m_settings,0x4055);
  if (last_average < 1) {
    last_average = max_open_files();
  }
  session_settings::set_int(&this->m_settings,0x4055,last_average);
  iVar2 = num_connections(this);
  iVar3 = session_settings::get_int(&this->m_settings,0x4055);
  if ((iVar3 < iVar2) &&
     (bVar1 = torrent_list<libtorrent::aux::torrent>::empty(&this->m_torrents), !bVar1)) {
    iVar2 = num_connections(this);
    iVar3 = session_settings::get_int(&this->m_settings,0x4055);
    average = iVar2 - iVar3;
    extra = 0;
    iVar2 = session_settings::get_int(&this->m_settings,0x4055);
    sVar4 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
    iter = iVar2 / (int)sVar4;
    iVar2 = session_settings::get_int(&this->m_settings,0x4055);
    sVar4 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
    num_above = iVar2 % (int)sVar4;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      __range4._4_4_ = 0;
      __end4 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
      t = (shared_ptr<libtorrent::aux::torrent> *)
          torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                         *)&t), bVar1) {
        this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                     ::operator*(&__end4);
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        iVar2 = torrent::num_peers(peVar5);
        if (extra < iVar2) {
          if (iter < iVar2) {
            __range4._4_4_ = __range4._4_4_ + 1;
          }
          if (iVar2 < iter) {
            num_above = (iter - iVar2) + num_above;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
        ::operator++(&__end4);
      }
      if (__range4._4_4_ == 0) {
        __range4._4_4_ = 1;
      }
      extra = iter;
      iter = num_above / __range4._4_4_ + iter;
      if (num_above == 0) break;
      num_above = num_above % __range4._4_4_;
    }
    __end3 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    t_1 = (shared_ptr<libtorrent::aux::torrent> *)
          torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                       *)&t_1), bVar1) {
      _my_average = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                       ::operator*(&__end3);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(_my_average);
      disconnect = torrent::num_peers(peVar5);
      if (iter < disconnect) {
        local_80 = iter;
        if (0 < num_above) {
          local_80 = iter + 1;
          num_above = num_above + -1;
        }
        local_88 = disconnect - local_80;
        piVar6 = ::std::min<int>(&average,&local_88);
        local_84 = *piVar6;
        average = average - local_84;
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(_my_average);
        iVar2 = local_84;
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_98,too_many_connections,(type *)0x0);
        torrent::disconnect_peers(peVar5,iVar2,&local_98);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void session_impl::update_connections_limit()
	{
		int limit = m_settings.get_int(settings_pack::connections_limit);

		if (limit <= 0) limit = max_open_files();

		m_settings.set_int(settings_pack::connections_limit, limit);

		if (num_connections() > m_settings.get_int(settings_pack::connections_limit)
			&& !m_torrents.empty())
		{
			// if we have more connections that we're allowed, disconnect
			// peers from the torrents so that they are all as even as possible

			int to_disconnect = num_connections() - m_settings.get_int(settings_pack::connections_limit);

			int last_average = 0;
			int average = m_settings.get_int(settings_pack::connections_limit) / int(m_torrents.size());

			// the number of slots that are unused by torrents
			int extra = m_settings.get_int(settings_pack::connections_limit) % int(m_torrents.size());

			// run 3 iterations of this, then we're probably close enough
			for (int iter = 0; iter < 4; ++iter)
			{
				// the number of torrents that are above average
				int num_above = 0;
				for (auto const& t : m_torrents)
				{
					int const num = t->num_peers();
					if (num <= last_average) continue;
					if (num > average) ++num_above;
					if (num < average) extra += average - num;
				}

				// distribute extra among the torrents that are above average
				if (num_above == 0) num_above = 1;
				last_average = average;
				average += extra / num_above;
				if (extra == 0) break;
				// save the remainder for the next iteration
				extra = extra % num_above;
			}

			for (auto const& t : m_torrents)
			{
				int const num = t->num_peers();
				if (num <= average) continue;

				// distribute the remainder
				int my_average = average;
				if (extra > 0)
				{
					++my_average;
					--extra;
				}

				int const disconnect = std::min(to_disconnect, num - my_average);
				to_disconnect -= disconnect;
				t->disconnect_peers(disconnect, errors::too_many_connections);
			}
		}
	}